

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

BlockEntry * __thiscall mkvparser::Segment::GetBlock(Segment *this,CuePoint *cp,TrackPosition *tp)

{
  undefined1 auVar1 [16];
  bool bVar2;
  Cluster **ppCVar3;
  Cluster **ppCVar4;
  longlong lVar5;
  BlockEntry *pBVar6;
  Cluster *pCVar7;
  long idx_00;
  ptrdiff_t idx;
  Cluster *pCluster;
  longlong pos;
  Cluster *pCluster_1;
  Cluster **k;
  Cluster **j;
  Cluster **jj;
  long count;
  Cluster **i;
  Cluster **ii;
  TrackPosition *tp_local;
  CuePoint *cp_local;
  Segment *this_local;
  
  count = (long)this->m_clusters;
  ppCVar3 = (Cluster **)(count + (this->m_clusterCount + this->m_clusterPreloadCount) * 8);
  k = ppCVar3;
  while ((ulong)count < k) {
    auVar1._8_8_ = (long)k - count >> 0x3f;
    auVar1._0_8_ = (long)k - count >> 3;
    ppCVar4 = (Cluster **)(count + SUB168(auVar1 / SEXT816(2),0) * 8);
    if (ppCVar3 <= ppCVar4) {
      __assert_fail("k < jj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x875,
                    "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                   );
    }
    pCVar7 = *ppCVar4;
    if (pCVar7 == (Cluster *)0x0) {
      __assert_fail("pCluster",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x878,
                    "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                   );
    }
    lVar5 = Cluster::GetPosition(pCVar7);
    if (lVar5 < 0) {
      __assert_fail("pos >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x87f,
                    "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                   );
    }
    if (lVar5 < tp->m_pos) {
      count = (long)(ppCVar4 + 1);
    }
    else {
      k = ppCVar4;
      if (lVar5 <= tp->m_pos) {
        pBVar6 = Cluster::GetEntry(pCVar7,cp,tp);
        return pBVar6;
      }
    }
  }
  if ((Cluster **)count != k) {
    __assert_fail("i == j",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x889,
                  "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                 );
  }
  pCVar7 = Cluster::Create(this,-1,tp->m_pos);
  if (pCVar7 == (Cluster *)0x0) {
    return (BlockEntry *)0x0;
  }
  idx_00 = count - (long)this->m_clusters >> 3;
  bVar2 = PreloadCluster(this,pCVar7,idx_00);
  if (!bVar2) {
    if (pCVar7 != (Cluster *)0x0) {
      Cluster::~Cluster(pCVar7);
      operator_delete(pCVar7);
    }
    return (BlockEntry *)0x0;
  }
  if (this->m_clusters != (Cluster **)0x0) {
    if (this->m_clusterPreloadCount < 1) {
      __assert_fail("m_clusterPreloadCount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x897,
                    "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                   );
    }
    if (this->m_clusters[idx_00] == pCVar7) {
      pBVar6 = Cluster::GetEntry(pCVar7,cp,tp);
      return pBVar6;
    }
    __assert_fail("m_clusters[idx] == pCluster",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x898,
                  "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                 );
  }
  __assert_fail("m_clusters",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                ,0x896,
                "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
               );
}

Assistant:

const BlockEntry* Segment::GetBlock(const CuePoint& cp,
                                    const CuePoint::TrackPosition& tp) {
  Cluster** const ii = m_clusters;
  Cluster** i = ii;

  const long count = m_clusterCount + m_clusterPreloadCount;

  Cluster** const jj = ii + count;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[ii, i) < pTP->m_pos
    //[i, j) ?
    //[j, jj)  > pTP->m_pos

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pCluster = *k;
    assert(pCluster);

    // const long long pos_ = pCluster->m_pos;
    // assert(pos_);
    // const long long pos = pos_ * ((pos_ < 0) ? -1 : 1);

    const long long pos = pCluster->GetPosition();
    assert(pos >= 0);

    if (pos < tp.m_pos)
      i = k + 1;
    else if (pos > tp.m_pos)
      j = k;
    else
      return pCluster->GetEntry(cp, tp);
  }

  assert(i == j);
  // assert(Cluster::HasBlockEntries(this, tp.m_pos));

  Cluster* const pCluster = Cluster::Create(this, -1, tp.m_pos);  //, -1);
  if (pCluster == NULL)
    return NULL;

  const ptrdiff_t idx = i - m_clusters;

  if (!PreloadCluster(pCluster, idx)) {
    delete pCluster;
    return NULL;
  }
  assert(m_clusters);
  assert(m_clusterPreloadCount > 0);
  assert(m_clusters[idx] == pCluster);

  return pCluster->GetEntry(cp, tp);
}